

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_alias.cpp
# Opt level: O2

string * duckdb::ExtensionHelper::ApplyExtensionAlias
                   (string *__return_storage_ptr__,string *extension_name)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  string lname;
  allocator local_41;
  string local_40;
  
  StringUtil::Lower(&local_40,extension_name);
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0x90) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,local_40.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_40.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_40._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,local_40.field_2._M_local_buf[0])
        ;
      }
      __return_storage_ptr__->_M_string_length = local_40._M_string_length;
      local_40._M_string_length = 0;
      local_40.field_2._M_local_buf[0] = '\0';
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      goto LAB_0040af8c;
    }
    bVar2 = ::std::operator==(&local_40,*(char **)((long)&internal_aliases + lVar3));
    lVar1 = lVar3 + 0x10;
  } while (!bVar2);
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             *(char **)((long)&PTR_anon_var_dwarf_a0fc4e_0177e058 + lVar3),&local_41);
LAB_0040af8c:
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string ExtensionHelper::ApplyExtensionAlias(const string &extension_name) {
	auto lname = StringUtil::Lower(extension_name);
	for (idx_t index = 0; internal_aliases[index].alias; index++) {
		if (lname == internal_aliases[index].alias) {
			return internal_aliases[index].extension;
		}
	}
	return lname;
}